

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_NtkOptNodeAnalyze
               (Acb_Mfs_t *p,int PivotVar,int nDivs,int nValues,int *pValues,Vec_Int_t *vSupp)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  word Diffs [64];
  word OffSet [64];
  word OnSet [64];
  ulong local_638 [64];
  ulong local_438 [64];
  ulong local_238 [65];
  
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  memset(local_638,0,0x200);
  iVar3 = nDivs * 2 + 1;
  uVar17 = (long)nValues / (long)iVar3;
  uVar10 = nDivs - 0x40;
  if (nDivs < 0x40) {
    uVar10 = 0;
  }
  uVar13 = 0x40;
  if (nDivs < 0x40) {
    uVar13 = nDivs;
  }
  if (nValues % iVar3 != 0) {
    __assert_fail("nValues % nScope == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x4d4,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  iVar1 = (int)uVar17;
  if (0x10 < iVar1) {
    __assert_fail("nFrames <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x4d5,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  uVar12 = uVar17 & 0xffffffff;
  if (0 < iVar1) {
    uVar9 = 0x40;
    if (0x40 < nDivs) {
      uVar9 = (ulong)(uint)nDivs;
    }
    piVar5 = pValues + (uVar9 - 0x3f);
    lVar16 = ((long)(int)uVar13 - uVar9) + 0x40;
    uVar9 = 0;
    do {
      iVar7 = 0;
      iVar4 = nDivs;
      if (pValues[uVar9 * (long)iVar3] == 0) {
        iVar4 = 0;
        iVar7 = nDivs;
      }
      printf("%2d:",uVar9 & 0xffffffff);
      if ((int)uVar10 < (int)uVar13) {
        lVar14 = 0;
        do {
          printf("%d",(ulong)(uint)piVar5[iVar7 + lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar16 != lVar14);
      }
      putchar(10);
      printf("%2d:",uVar9 & 0xffffffff);
      if ((int)uVar10 < (int)uVar13) {
        lVar14 = 0;
        do {
          printf("%d",(ulong)(uint)piVar5[iVar4 + lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar16 != lVar14);
      }
      putchar(10);
      if ((int)uVar10 < (int)uVar13) {
        lVar14 = 0;
        do {
          if (piVar5[iVar7 + lVar14] != 0) {
            local_238[uVar9] = local_238[uVar9] | 1L << ((byte)lVar14 & 0x3f);
          }
          if (piVar5[iVar4 + lVar14] != 0) {
            local_438[uVar9] = local_438[uVar9] | 1L << ((byte)lVar14 & 0x3f);
          }
          lVar14 = lVar14 + 1;
        } while (lVar16 != lVar14);
      }
      uVar9 = uVar9 + 1;
      piVar5 = piVar5 + (long)(nDivs * 2) + 1;
    } while (uVar9 != uVar12);
  }
  uVar9 = (ulong)uVar10;
  if (iVar1 < 1) {
    uVar15 = 0;
  }
  else {
    uVar2 = 0;
    uVar15 = 0;
    do {
      uVar6 = 0;
      do {
        if ((int)uVar15 < 1) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          do {
            if (local_638[uVar11] == (local_438[uVar6] ^ local_238[uVar2])) goto LAB_0037d05a;
            uVar11 = uVar11 + 1;
          } while (uVar15 != uVar11);
          uVar11 = (ulong)uVar15;
        }
LAB_0037d05a:
        if ((int)uVar15 < 0x40 && (int)uVar15 <= (int)uVar11) {
          lVar16 = (long)(int)uVar15;
          uVar15 = uVar15 + 1;
          local_638[lVar16] = local_438[uVar6] ^ local_238[uVar2];
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar12);
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar12);
  }
  printf("Divisors = %d.  Frames = %d.  Patterns = %d.\n",(ulong)(uint)nDivs,uVar17 & 0xffffffff,
         (ulong)uVar15);
  printf("   ");
  uVar17 = uVar9;
  uVar8 = uVar10;
  while ((int)uVar8 < (int)uVar13) {
    printf("%d",uVar17 / 10);
    uVar8 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar8;
  }
  putchar(10);
  printf("   ");
  uVar17 = uVar9;
  uVar8 = uVar10;
  while ((int)uVar8 < (int)uVar13) {
    printf("%d",(ulong)(uint)((int)uVar17 + (int)(uVar17 / 10) * -10));
    uVar8 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar8;
  }
  putchar(10);
  printf("   ");
joined_r0x0037d161:
  if ((int)uVar13 <= (int)uVar10) {
    putchar(10);
    if (0 < (int)uVar15) {
      uVar17 = 0;
      do {
        printf("%2d:",uVar17 & 0xffffffff);
        if (0 < nDivs) {
          uVar12 = local_638[uVar17];
          uVar9 = 0;
          do {
            iVar3 = 0x2a;
            if ((uVar12 >> (uVar9 & 0x3f) & 1) == 0) {
              iVar3 = 0x20;
            }
            putchar(iVar3);
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        putchar(10);
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar15);
    }
    return;
  }
  lVar16 = (long)vSupp->nSize;
  iVar3 = 0x20;
  iVar1 = (int)uVar9;
  if (0 < lVar16) {
    lVar14 = 0;
    do {
      if (vSupp->pArray[lVar14] == iVar1) {
        iVar3 = 0x60;
        if (0 < vSupp->nSize) {
          lVar14 = 0;
          goto LAB_0037d196;
        }
        break;
      }
      lVar14 = lVar14 + 1;
    } while (lVar16 != lVar14);
  }
  goto LAB_0037d1ab;
  while (lVar14 = lVar14 + 1, lVar16 != lVar14) {
LAB_0037d196:
    if (vSupp->pArray[lVar14] == iVar1) {
      iVar3 = (int)lVar14 + 0x61;
      break;
    }
  }
LAB_0037d1ab:
  putchar(iVar3);
  uVar10 = iVar1 + 1;
  uVar9 = (ulong)uVar10;
  goto joined_r0x0037d161;
}

Assistant:

void Acb_NtkOptNodeAnalyze( Acb_Mfs_t * p, int PivotVar, int nDivs, int nValues, int * pValues, Vec_Int_t * vSupp )
{
    word OnSet[64] = {0};
    word OffSet[64] = {0};
    word Diffs[64] = {0};
    int s, nScope = 1 + 2*nDivs, d, i;
    int f, nFrames = nValues / nScope;
    int start = nDivs < 64 ? 0 : nDivs - 64;
    int stop  = nDivs < 64 ? nDivs : 64;
    assert( nValues % nScope == 0 );
    assert( nFrames <= 16 );
    for ( f = 0; f < nFrames; f++ )
    {
        int * pStart  = pValues + f * nScope;
        int * pOnSet  = pStart + 1 + (pStart[0] ? 0 : nDivs);
        int * pOffSet = pStart + 1 + (pStart[0] ? nDivs : 0);

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOnSet[s] );
        printf( "\n" );

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOffSet[s] );
        printf( "\n" );

        for ( s = start; s < stop; s++ )
        {
            if ( pOnSet[s] )   OnSet[f]  |= (((word)1) << (s-start));
            if ( pOffSet[s] )  OffSet[f] |= (((word)1) << (s-start));
        }
    }
    d = 0;
    for ( f = 0; f < nFrames; f++ )
    for ( s = 0; s < nFrames; s++ )
    {
        for ( i = 0; i < d; i++ )
            if ( Diffs[i] == (OnSet[f] ^ OffSet[s]) )
                break;
        if ( i < d )
            continue;
        if ( d < 64 )
            Diffs[d++] = OnSet[f] ^ OffSet[s];
    }

    printf( "Divisors = %d.  Frames = %d.  Patterns = %d.\n", nDivs, nFrames, d );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s / 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s % 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%c", Vec_IntFind(vSupp, s) >= 0 ? 'a' + Vec_IntFind(vSupp, s) : ' ' );
    printf( "\n" );
    for ( s = 0; s < d; s++ )
    {
        printf( "%2d:", s );
        for ( f = 0; f < stop; f++ )
            printf( "%c", ((Diffs[s] >> f) & 1) ? '*' : ' ' );
        printf( "\n" );
    }
}